

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeArrayCopy<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  Err local_130;
  Err *local_110;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Result<wasm::Ok> srcType;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  Result<wasm::Ok> _val;
  Result<wasm::Ok> destType;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDeclsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  typeidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)__return_storage_ptr___00,ctx);
  Result<wasm::Ok>::Result
            ((Result<wasm::Ok> *)local_78,(Result<wasm::Ok> *)__return_storage_ptr___00);
  local_90 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_78);
  bVar1 = local_90 == (Err *)0x0;
  if (!bVar1) {
    wasm::Err::Err(&local_b0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_78);
  if (bVar1) {
    typeidx<wasm::WATParser::ParseDeclsCtx>
              ((Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
    Result<wasm::Ok>::Result
              ((Result<wasm::Ok> *)&err_1,
               (Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    local_110 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
    bVar1 = local_110 == (Err *)0x0;
    if (!bVar1) {
      wasm::Err::Err(&local_130,local_110);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_130);
      wasm::Err::~Err(&local_130);
    }
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
    if (bVar1) {
      Result<wasm::Ok>::operator*
                ((Result<wasm::Ok> *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      Result<wasm::Ok>::operator*
                ((Result<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      NullInstrParserCtx::makeArrayCopy<wasm::Ok>
                (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,annotations);
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  Result<wasm::Ok>::~Result
            ((Result<wasm::Ok> *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<>
makeArrayCopy(Ctx& ctx, Index pos, const std::vector<Annotation>& annotations) {
  auto destType = typeidx(ctx);
  CHECK_ERR(destType);
  auto srcType = typeidx(ctx);
  CHECK_ERR(srcType);
  return ctx.makeArrayCopy(pos, annotations, *destType, *srcType);
}